

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

CURLcode tool2curlparts(CURL *curl,tool_mime *m,curl_mime *mime)

{
  char *local_40;
  char *filename;
  curl_mime *submime;
  curl_mimepart *part;
  curl_mime *pcStack_20;
  CURLcode ret;
  curl_mime *mime_local;
  tool_mime *m_local;
  CURL *curl_local;
  
  part._4_4_ = CURLE_OK;
  submime = (curl_mime *)0x0;
  filename = (char *)0x0;
  local_40 = (char *)0x0;
  if (m != (tool_mime *)0x0) {
    pcStack_20 = mime;
    mime_local = (curl_mime *)m;
    m_local = (tool_mime *)curl;
    part._4_4_ = tool2curlparts(curl,m->prev,mime);
    if ((part._4_4_ == CURLE_OK) &&
       (submime = (curl_mime *)curl_mime_addpart(pcStack_20), submime == (curl_mime *)0x0)) {
      part._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    if (part._4_4_ == CURLE_OK) {
      local_40 = *(char **)(mime_local + 0x28);
      switch(*(undefined4 *)mime_local) {
      case 1:
        part._4_4_ = tool2curlmime(m_local,(tool_mime *)mime_local,(curl_mime **)&filename);
        if ((part._4_4_ == CURLE_OK) &&
           (part._4_4_ = curl_mime_subparts(submime,filename), part._4_4_ != CURLE_OK)) {
          curl_mime_free(filename);
        }
        break;
      case 2:
        part._4_4_ = curl_mime_data(submime,*(undefined8 *)(mime_local + 0x18),0xffffffffffffffff);
        break;
      case 3:
      case 4:
        part._4_4_ = curl_mime_filedata(submime,*(undefined8 *)(mime_local + 0x18));
        if (((part._4_4_ == CURLE_OK) && (*(int *)mime_local == 4)) && (local_40 == (char *)0x0)) {
          part._4_4_ = curl_mime_filename(submime,0);
        }
        break;
      case 5:
        if (local_40 == (char *)0x0) {
          local_40 = "-";
        }
      case 6:
        part._4_4_ = curl_mime_data_cb(submime,*(undefined8 *)(mime_local + 0x58),
                                       tool_mime_stdin_read,tool_mime_stdin_seek,0,mime_local);
      }
    }
    if ((part._4_4_ == CURLE_OK) && (local_40 != (char *)0x0)) {
      part._4_4_ = curl_mime_filename(submime,local_40);
    }
    if (part._4_4_ == CURLE_OK) {
      part._4_4_ = curl_mime_type(submime,*(undefined8 *)(mime_local + 0x30));
    }
    if (part._4_4_ == CURLE_OK) {
      part._4_4_ = curl_mime_headers(submime,*(undefined8 *)(mime_local + 0x40),0);
    }
    if (part._4_4_ == CURLE_OK) {
      part._4_4_ = curl_mime_encoder(submime,*(undefined8 *)(mime_local + 0x38));
    }
    if (part._4_4_ == CURLE_OK) {
      part._4_4_ = curl_mime_name(submime,*(undefined8 *)(mime_local + 0x20));
    }
  }
  return part._4_4_;
}

Assistant:

static CURLcode tool2curlparts(CURL *curl, struct tool_mime *m,
                               curl_mime *mime)
{
  CURLcode ret = CURLE_OK;
  curl_mimepart *part = NULL;
  curl_mime *submime = NULL;
  const char *filename = NULL;

  if(m) {
    ret = tool2curlparts(curl, m->prev, mime);
    if(!ret) {
      part = curl_mime_addpart(mime);
      if(!part)
        ret = CURLE_OUT_OF_MEMORY;
    }
    if(!ret) {
      filename = m->filename;
      switch(m->kind) {
      case TOOLMIME_PARTS:
        ret = tool2curlmime(curl, m, &submime);
        if(!ret) {
          ret = curl_mime_subparts(part, submime);
          if(ret)
            curl_mime_free(submime);
        }
        break;

      case TOOLMIME_DATA:
        ret = curl_mime_data(part, m->data, CURL_ZERO_TERMINATED);
        break;

      case TOOLMIME_FILE:
      case TOOLMIME_FILEDATA:
        ret = curl_mime_filedata(part, m->data);
        if(!ret && m->kind == TOOLMIME_FILEDATA && !filename)
          ret = curl_mime_filename(part, NULL);
        break;

      case TOOLMIME_STDIN:
        if(!filename)
          filename = "-";
        FALLTHROUGH();
      case TOOLMIME_STDINDATA:
        ret = curl_mime_data_cb(part, m->size,
                                (curl_read_callback) tool_mime_stdin_read,
                                (curl_seek_callback) tool_mime_stdin_seek,
                                NULL, m);
        break;

      default:
        /* Other cases not possible in this context. */
        break;
      }
    }
    if(!ret && filename)
      ret = curl_mime_filename(part, filename);
    if(!ret)
      ret = curl_mime_type(part, m->type);
    if(!ret)
      ret = curl_mime_headers(part, m->headers, 0);
    if(!ret)
      ret = curl_mime_encoder(part, m->encoder);
    if(!ret)
      ret = curl_mime_name(part, m->name);
  }
  return ret;
}